

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  StringEntry *pSVar6;
  ulong uVar7;
  string *psVar8;
  size_type sVar9;
  ostream *poVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  cmSystemToolsRPathInfo *local_648;
  cmSystemToolsRPathInfo *local_570;
  ulong local_568;
  unsigned_long j;
  __mbstate_t local_558;
  int local_54c;
  undefined1 auStack_548 [4];
  int i_1;
  ofstream f;
  string local_328 [32];
  size_type local_308;
  size_type prefix_len;
  undefined1 local_2e0 [8];
  ostringstream e;
  size_type pos;
  int i;
  StringEntry *se_runpath;
  StringEntry *se_rpath;
  char *se_name [2];
  StringEntry *se [2];
  uint local_120;
  int se_count;
  undefined1 local_110 [8];
  cmELF elf;
  cmSystemToolsRPathInfo rp [2];
  int local_3c;
  bool remove_rpath;
  int rp_count;
  bool *changed_local;
  string *emsg_local;
  string *newRPath_local;
  string *oldRPath_local;
  string *file_local;
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  local_3c = 0;
  bVar2 = true;
  local_570 = (cmSystemToolsRPathInfo *)((long)&elf.ErrorMessage.field_2 + 8);
  do {
    cmSystemToolsRPathInfo::cmSystemToolsRPathInfo(local_570);
    local_570 = local_570 + 1;
  } while (local_570 != (cmSystemToolsRPathInfo *)((long)&rp[1].Value.field_2 + 8));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_110,pcVar5);
  se_name[1] = (char *)0x0;
  se_name[0] = (char *)0x0;
  pSVar6 = cmELF::GetRPath((cmELF *)local_110);
  if (pSVar6 != (StringEntry *)0x0) {
    se_name[1] = (char *)pSVar6;
  }
  local_120 = (uint)(pSVar6 != (StringEntry *)0x0);
  pSVar6 = cmELF::GetRunPath((cmELF *)local_110);
  if (pSVar6 != (StringEntry *)0x0) {
    se_name[(long)(int)local_120 + 1] = (char *)pSVar6;
    se_name[(long)(int)local_120 + -1] = "RUNPATH";
    local_120 = local_120 + 1;
  }
  if (local_120 == 0) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)emsg,"No valid ELF RPATH or RUNPATH entry exists in the file; ");
        psVar8 = cmELF::GetErrorMessage_abi_cxx11_((cmELF *)local_110);
        std::__cxx11::string::operator+=((string *)emsg,(string *)psVar8);
      }
      file_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      file_local._7_1_ = 1;
      bVar1 = true;
    }
  }
  else {
    for (pos._0_4_ = 0; (int)pos < (int)local_120; pos._0_4_ = (int)pos + 1) {
      if ((local_3c == 0) ||
         (elf.ErrorMessage.field_2._8_8_ != *(long *)(se_name[(long)(int)pos + 1] + 0x20))) {
        sVar9 = cmSystemToolsFindRPath((string *)se_name[(long)(int)pos + 1],oldRPath);
        if (sVar9 == 0xffffffffffffffff) {
          sVar9 = cmSystemToolsFindRPath((string *)se_name[(long)(int)pos + 1],newRPath);
          if (sVar9 == 0xffffffffffffffff) {
            if (emsg != (string *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
              poVar10 = std::operator<<((ostream *)local_2e0,"The current ");
              poVar10 = std::operator<<(poVar10,se_name[(long)(int)pos + -1]);
              poVar10 = std::operator<<(poVar10," is:\n");
              poVar10 = std::operator<<(poVar10,"  ");
              poVar10 = std::operator<<(poVar10,(string *)se_name[(long)(int)pos + 1]);
              poVar10 = std::operator<<(poVar10,"\n");
              poVar10 = std::operator<<(poVar10,"which does not contain:\n");
              poVar10 = std::operator<<(poVar10,"  ");
              poVar10 = std::operator<<(poVar10,(string *)oldRPath);
              poVar10 = std::operator<<(poVar10,"\n");
              std::operator<<(poVar10,"as was expected.");
              std::__cxx11::ostringstream::str();
              std::__cxx11::string::operator=((string *)emsg,(string *)&prefix_len);
              std::__cxx11::string::~string((string *)&prefix_len);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
            }
            file_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0070daf5;
          }
          bVar2 = false;
        }
        else {
          *(undefined8 *)((long)&rp[(long)local_3c + -1].Value.field_2 + 8) =
               *(undefined8 *)(se_name[(long)(int)pos + 1] + 0x20);
          rp[local_3c].Position = *(unsigned_long *)(se_name[(long)(int)pos + 1] + 0x28);
          std::__cxx11::string::operator=((string *)&rp[local_3c].Size,se_name[(long)(int)pos + -1])
          ;
          local_308 = sVar9;
          uVar7 = std::__cxx11::string::empty();
          if ((((uVar7 & 1) != 0) && (sVar9 != 0)) &&
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)se_name[(long)(int)pos + 1]),
             *pcVar5 == ':')) {
            lVar12 = std::__cxx11::string::length();
            lVar11 = std::__cxx11::string::length();
            if (sVar9 + lVar12 == lVar11) {
              local_308 = local_308 - 1;
            }
          }
          std::__cxx11::string::substr((ulong)local_328,(ulong)se_name[(long)(int)pos + 1]);
          std::__cxx11::string::operator=
                    ((string *)(rp[local_3c].Name.field_2._M_local_buf + 8),local_328);
          std::__cxx11::string::~string(local_328);
          std::__cxx11::string::operator+=
                    ((string *)(rp[local_3c].Name.field_2._M_local_buf + 8),(string *)newRPath);
          pcVar5 = se_name[(long)(int)pos + 1];
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)&f.field_0x1f8,(ulong)pcVar5);
          std::__cxx11::string::operator+=
                    ((string *)(rp[local_3c].Name.field_2._M_local_buf + 8),(string *)&f.field_0x1f8
                    );
          std::__cxx11::string::~string((string *)&f.field_0x1f8);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            bVar2 = false;
          }
          uVar7 = rp[local_3c].Position;
          lVar12 = std::__cxx11::string::length();
          if (uVar7 < lVar12 + 1U) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::operator=
                        ((string *)emsg,"The replacement path is too long for the ");
              std::__cxx11::string::operator+=((string *)emsg,se_name[(long)(int)pos + -1]);
              std::__cxx11::string::operator+=((string *)emsg," entry.");
            }
            file_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0070daf5;
          }
          local_3c = local_3c + 1;
        }
      }
    }
    bVar1 = false;
  }
LAB_0070daf5:
  cmELF::~cmELF((cmELF *)local_110);
  if (!bVar1) {
    if (local_3c == 0) {
      file_local._7_1_ = 1;
    }
    else if (bVar2) {
      file_local._7_1_ = RemoveRPath(file,emsg,changed);
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      _Var4 = std::operator|(_S_in,_S_out);
      _Var4 = std::operator|(_Var4,_S_bin);
      std::ofstream::ofstream(auStack_548,pcVar5,_Var4);
      bVar3 = std::ios::operator!((ios *)(auStack_548 + (long)_auStack_548[-3]));
      if ((bVar3 & 1) == 0) {
        for (local_54c = 0; local_54c < local_3c; local_54c = local_54c + 1) {
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)&j,
                     *(streamoff *)((long)&rp[(long)local_54c + -1].Value.field_2 + 8));
          plVar13 = (long *)std::ostream::seekp(auStack_548,j,local_558);
          bVar3 = std::ios::operator!((ios *)((long)plVar13 + *(long *)(*plVar13 + -0x18)));
          if ((bVar3 & 1) != 0) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::operator=((string *)emsg,"Error seeking to ");
              std::__cxx11::string::operator+=((string *)emsg,(string *)&rp[local_54c].Size);
              std::__cxx11::string::operator+=((string *)emsg," position.");
            }
            file_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_0070de75;
          }
          std::operator<<((ostream *)auStack_548,
                          (string *)(rp[local_54c].Name.field_2._M_local_buf + 8));
          for (local_568 = std::__cxx11::string::length(); local_568 < rp[local_54c].Position;
              local_568 = local_568 + 1) {
            std::operator<<((ostream *)auStack_548,'\0');
          }
          bVar3 = std::ios::operator!((ios *)(auStack_548 + (long)_auStack_548[-3]));
          if ((bVar3 & 1) != 0) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::operator=((string *)emsg,"Error writing the new ");
              std::__cxx11::string::operator+=((string *)emsg,(string *)&rp[local_54c].Size);
              std::__cxx11::string::operator+=((string *)emsg," string to the file.");
            }
            file_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_0070de75;
          }
        }
        bVar2 = false;
      }
      else {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=((string *)emsg,"Error opening file for update.");
        }
        file_local._7_1_ = 0;
        bVar2 = true;
      }
LAB_0070de75:
      std::ofstream::~ofstream(auStack_548);
      if (!bVar2) {
        if (changed != (bool *)0x0) {
          *changed = true;
        }
        file_local._7_1_ = 1;
      }
    }
  }
  local_648 = (cmSystemToolsRPathInfo *)((long)&rp[1].Value.field_2 + 8);
  do {
    local_648 = local_648 + -1;
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo(local_648);
  } while (local_648 != (cmSystemToolsRPathInfo *)((long)&elf.ErrorMessage.field_2 + 8));
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath, std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { CM_NULLPTR, CM_NULLPTR };
    const char* se_name[2] = { CM_NULLPTR, CM_NULLPTR };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      if (newRPath.empty()) {
        // The new rpath is empty and there is no rpath anyway so it is
        // okay.
        return true;
      }
      if (emsg) {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
      }
      return false;
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Make sure the current rpath contains the old rpath.
      std::string::size_type pos =
        cmSystemToolsFindRPath(se[i]->Value, oldRPath);
      if (pos == std::string::npos) {
        // If it contains the new rpath instead then it is okay.
        if (cmSystemToolsFindRPath(se[i]->Value, newRPath) !=
            std::string::npos) {
          remove_rpath = false;
          continue;
        }
        if (emsg) {
          std::ostringstream e;
          /* clang-format off */
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
          /* clang-format on */
          *emsg = e.str();
        }
        return false;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      std::string::size_type prefix_len = pos;

      // If oldRPath was at the end of the file's RPath, and newRPath is empty,
      // we should remove the unnecessary ':' at the end.
      if (newRPath.empty() && pos > 0 && se[i]->Value[pos - 1] == ':' &&
          pos + oldRPath.length() == se[i]->Value.length()) {
        prefix_len--;
      }

      // Construct the new value which preserves the part of the path
      // not being changed.
      rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
      rp[rp_count].Value += newRPath;
      rp[rp_count].Value += se[i]->Value.substr(pos + oldRPath.length());

      if (!rp[rp_count].Value.empty()) {
        remove_rpath = false;
      }

      // Make sure there is enough room to store the new rpath and at
      // least one null terminator.
      if (rp[rp_count].Size < rp[rp_count].Value.length() + 1) {
        if (emsg) {
          *emsg = "The replacement path is too long for the ";
          *emsg += se_name[i];
          *emsg += " entry.";
        }
        return false;
      }

      // This entry is ready for update.
      ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = "Error seeking to ";
          *emsg += rp[i].Name;
          *emsg += " position.";
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = "Error writing the new ";
          *emsg += rp[i].Name;
          *emsg += " string to the file.";
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}